

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InvalidInputException::InvalidInputException<unsigned_char>
          (InvalidInputException *this,string *msg,uchar params)

{
  string local_30;
  
  Exception::ConstructMessage<unsigned_char>(&local_30,msg,params);
  InvalidInputException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}